

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filters.h
# Opt level: O0

void __thiscall
gpu::BlendFilters<unsigned_char>::hardMix
          (BlendFilters<unsigned_char> *this,uchar *baseLayer,uchar *blendLayer,uchar *destination,
          float alpha)

{
  int iVar1;
  undefined4 local_40;
  undefined4 local_3c;
  undefined4 local_38;
  undefined4 local_34;
  undefined4 local_30;
  float blendValueNormalized;
  float blendValue;
  float alpha_local;
  uchar *destination_local;
  uchar *blendLayer_local;
  uchar *baseLayer_local;
  BlendFilters<unsigned_char> *this_local;
  
  if (*blendLayer < 0x80) {
    if (*blendLayer == '\0') {
      local_30 = (uint)*blendLayer << 1;
    }
    else {
      if (0xff - (int)((0xff - (uint)*baseLayer) * 0x100) / (int)((uint)*blendLayer << 1) < 0) {
        local_34 = 0;
      }
      else {
        local_34 = 0xff - (int)((0xff - (uint)*baseLayer) * 0x100) / (int)((uint)*blendLayer << 1);
      }
      local_30 = local_34;
    }
    local_38 = local_30;
  }
  else {
    if ((*blendLayer - 0x80) * 2 == 0xff) {
      local_3c = (*blendLayer - 0x80) * 2;
    }
    else {
      if ((int)((uint)*baseLayer << 8) / (int)((*blendLayer - 0x80) * -2 + 0xff) < 0x100) {
        local_40 = (int)((uint)*baseLayer << 8) / (int)((*blendLayer - 0x80) * -2 + 0xff);
      }
      else {
        local_40 = 0xff;
      }
      local_3c = local_40;
    }
    local_38 = local_3c;
  }
  iVar1 = 0xff;
  if (local_38 < 0x80) {
    iVar1 = 0;
  }
  blendValueNormalized = (1.0 - alpha) * (float)*baseLayer + alpha * (float)iVar1;
  if (blendValueNormalized <= 255.0) {
    if (blendValueNormalized < 0.0) {
      blendValueNormalized = 0.0;
    }
  }
  else {
    blendValueNormalized = 255.0;
  }
  *destination = (uchar)(int)blendValueNormalized;
  return;
}

Assistant:

FUNCTION_PREFIX void BlendFilters<T>::hardMix(const T& baseLayer,const T& blendLayer, T& destination, float alpha)
    {
      float blendValue=ChannelBlend_HardMix(baseLayer,blendLayer);
      float blendValueNormalized=(1.0-alpha)*baseLayer+alpha*blendValue;
      PIXEL_DOMAIN_CHECK(blendValueNormalized);
      destination=(T)blendValueNormalized;
    }